

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::parseInto
          (CommandLine<Catch::ConfigData> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,ConfigData *config)

{
  const_reference pvVar1;
  long lVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *in_RSI;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *in_RDI;
  Parser parser;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> tokens;
  size_t lastSlash;
  string processName;
  ConfigData *in_stack_ffffffffffffff38;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *this_00;
  Parser local_a8 [2];
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
  *in_stack_ffffffffffffff90;
  ConfigData *in_stack_ffffffffffffff98;
  Parser *in_stack_ffffffffffffffa0;
  CommandLine<Catch::ConfigData> *in_stack_ffffffffffffffa8;
  string local_40 [64];
  
  this_00 = in_RDI;
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDX,0);
  std::__cxx11::string::string(local_40,(string *)pvVar1);
  lVar2 = std::__cxx11::string::find_last_of((char *)local_40,0x1fa401);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff98,(ulong)local_40);
    std::__cxx11::string::operator=(local_40,(string *)&stack0xffffffffffffff98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  Detail::BoundArgFunction<Catch::ConfigData>::set
            ((BoundArgFunction<Catch::ConfigData> *)this_00,in_stack_ffffffffffffff38,
             (string *)0x1c5c31);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             0x1c5c3d);
  Parser::Parser(local_a8);
  Parser::parseIntoTokens
            (in_stack_ffffffffffffffa0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  populate(in_stack_ffffffffffffffa8,
           (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
           in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            (in_RSI);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::vector<Parser::Token> parseInto( std::vector<std::string> const& args, ConfigT& config ) const {
            std::string processName = args[0];
            std::size_t lastSlash = processName.find_last_of( "/\\" );
            if( lastSlash != std::string::npos )
                processName = processName.substr( lastSlash+1 );
            m_boundProcessName.set( config, processName );
            std::vector<Parser::Token> tokens;
            Parser parser;
            parser.parseIntoTokens( args, tokens );
            return populate( tokens, config );
        }